

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3aTextureMipmapTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles3::Accuracy::TextureCubeMipmapCase::iterate(TextureCubeMipmapCase *this)

{
  CoordType CVar1;
  int width;
  int height;
  TestLog *log;
  TextureCube *pTVar2;
  RenderContext *context;
  TestContext *this_00;
  int iVar3;
  deUint32 dVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar9;
  undefined4 extraout_var_01;
  NotSupportedError *this_01;
  ulong uVar10;
  long lVar11;
  RandomViewport viewport;
  uint local_210;
  vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> gridLayout;
  vector<float,_std::allocator<float>_> texCoord;
  Surface idealFrame;
  Surface renderedFrame;
  ReferenceParams local_160;
  int score;
  undefined4 uStack_c4;
  ConstPixelBufferAccess *pCStack_c0;
  ConstPixelBufferAccess *local_b8;
  ConstPixelBufferAccess *pCStack_b0;
  ConstPixelBufferAccess *local_a8;
  ConstPixelBufferAccess *pCStack_a0;
  ConstPixelBufferAccess *local_98;
  Sampler sampler;
  SurfaceAccess idealDst;
  long lVar8;
  
  iVar6 = (this->m_texture->m_refTexture).m_size;
  iVar7 = iVar6 * 2;
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar3);
  log = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  dVar4 = deStringHash((this->super_TestCase).super_TestNode.m_name._M_dataplus._M_p);
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            (&viewport,(RenderTarget *)CONCAT44(extraout_var_00,iVar3),iVar7,iVar7,dVar4);
  glu::mapGLSampler(&sampler,this->m_wrapS,this->m_wrapT,this->m_minFilter,0x2600);
  sampler.seamlessCubeMap = true;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  CVar1 = this->m_coordType;
  tcu::Surface::Surface(&renderedFrame,viewport.width,viewport.height);
  tcu::Surface::Surface(&idealFrame,viewport.width,viewport.height);
  if ((iVar7 <= viewport.width) && (iVar7 <= viewport.height)) {
    glu::TextureCube::upload(this->m_texture);
    (**(code **)(lVar8 + 8))(0x84c0);
    (**(code **)(lVar8 + 0xb8))(0x8513,this->m_texture->m_glTexture);
    (**(code **)(lVar8 + 0x1360))(0x8513,0x2802,this->m_wrapS);
    (**(code **)(lVar8 + 0x1360))(0x8513,0x2803,this->m_wrapT);
    (**(code **)(lVar8 + 0x1360))(0x8513,0x2801,this->m_minFilter);
    (**(code **)(lVar8 + 0x1360))(0x8513,0x2800,0x2600);
    dVar4 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar4,"After texture setup",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/accuracy/es3aTextureMipmapTests.cpp"
                    ,0x22d);
    gridLayout.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    gridLayout.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    gridLayout.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    deRandom_init((deRandom *)&local_160,7);
    randomPartition(&gridLayout,(Random *)&local_160,0,0,viewport.width,viewport.height);
    if (iterate()::s_projections == '\0') {
      iVar7 = __cxa_guard_acquire(&iterate()::s_projections);
      if (iVar7 != 0) {
        iterate::s_projections[0].m_data[0] = _DAT_009a4f70;
        iterate::s_projections[0].m_data[1] = _UNK_009a4f74;
        iterate::s_projections[0].m_data[2] = _UNK_009a4f78;
        iterate::s_projections[0].m_data[3] = _UNK_009a4f7c;
        iterate::s_projections[1].m_data[0] = _DAT_009a50b0;
        iterate::s_projections[1].m_data[1] = _UNK_009a50b4;
        iterate::s_projections[1].m_data[2] = _UNK_009a50b8;
        iterate::s_projections[1].m_data[3] = _UNK_009a50bc;
        iterate::s_projections[2].m_data[0] = _DAT_009a50c0;
        iterate::s_projections[2].m_data[1] = _UNK_009a50c4;
        iterate::s_projections[2].m_data[2] = _UNK_009a50c8;
        iterate::s_projections[2].m_data[3] = _UNK_009a50cc;
        iterate::s_projections[3].m_data[0] = _DAT_009a50d0;
        iterate::s_projections[3].m_data[1] = _UNK_009a50d4;
        iterate::s_projections[3].m_data[2] = _UNK_009a50d8;
        iterate::s_projections[3].m_data[3] = _UNK_009a50dc;
        __cxa_guard_release(&iterate()::s_projections);
      }
    }
    lVar11 = 0xc;
    uVar10 = 0;
    while( true ) {
      if ((long)(int)((ulong)((long)gridLayout.
                                    super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)gridLayout.
                                   super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 4) <= (long)uVar10)
      break;
      iVar7 = *(int *)((long)(gridLayout.
                              super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar11 + -0xc);
      iVar3 = *(int *)((long)(gridLayout.
                              super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar11 + -8);
      width = *(int *)((long)(gridLayout.
                              super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar11 + -4);
      height = *(int *)((long)(gridLayout.
                               super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar11);
      glu::TextureTestUtil::ReferenceParams::ReferenceParams(&local_160,TEXTURETYPE_CUBE);
      local_210 = (uint)uVar10;
      local_160.sampler.compareChannel = sampler.compareChannel;
      local_160.sampler.magFilter = sampler.magFilter;
      local_160.sampler.lodThreshold = sampler.lodThreshold;
      local_160.sampler.normalizedCoords = sampler.normalizedCoords;
      local_160.sampler._25_3_ = sampler._25_3_;
      local_160.sampler.compare = sampler.compare;
      local_160.sampler.wrapS = sampler.wrapS;
      local_160.sampler.wrapT = sampler.wrapT;
      local_160.sampler.wrapR = sampler.wrapR;
      local_160.sampler.minFilter = sampler.minFilter;
      local_160.sampler.borderColor.v._0_8_ = sampler.borderColor.v._0_8_;
      local_160.sampler.borderColor.v._8_8_ = sampler.borderColor.v._8_8_;
      local_160.sampler._53_3_ = sampler._53_3_;
      local_160.sampler.depthStencilMode = sampler.depthStencilMode;
      local_160.sampler.seamlessCubeMap = sampler.seamlessCubeMap;
      glu::TextureTestUtil::computeQuadTexCoordCube
                (&texCoord,(int)((uVar10 & 0xffffffff) / 6) * -6 + local_210);
      if (CVar1 == COORDTYPE_BASIC_BIAS) {
        local_160.super_RenderParams.flags._0_1_ = (byte)local_160.super_RenderParams.flags | 2;
        local_160.super_RenderParams.bias = Texture2DMipmapCase::iterate::s_bias[local_210 & 7];
      }
      else if (CVar1 == COORDTYPE_PROJECTED) {
        local_160.super_RenderParams.flags._0_1_ = (byte)local_160.super_RenderParams.flags | 1;
        uVar9 = (ulong)((local_210 & 3) << 4);
        local_160.super_RenderParams.w.m_data._0_8_ =
             *(undefined8 *)((long)iterate::s_projections[0].m_data + uVar9);
        local_160.super_RenderParams.w.m_data._8_8_ =
             *(undefined8 *)((long)iterate::s_projections[0].m_data + uVar9 + 8);
      }
      (**(code **)(lVar8 + 0x1a00))(viewport.x + iVar7,viewport.y + iVar3,width,height);
      deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
                (&this->m_renderer,0,
                 texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start,&local_160.super_RenderParams);
      iVar5 = (*this->m_renderCtx->_vptr_RenderContext[4])();
      tcu::SurfaceAccess::SurfaceAccess
                (&idealDst,&idealFrame,(PixelFormat *)(CONCAT44(extraout_var_01,iVar5) + 8),iVar7,
                 iVar3,width,height);
      local_160.lodMode = LODMODE_EXACT;
      pTVar2 = this->m_texture;
      local_98 = (pTVar2->m_refTexture).m_view.m_levels[5];
      score = (pTVar2->m_refTexture).m_view.m_numLevels;
      uStack_c4 = *(undefined4 *)&(pTVar2->m_refTexture).m_view.field_0x4;
      pCStack_c0 = (pTVar2->m_refTexture).m_view.m_levels[0];
      local_b8 = (pTVar2->m_refTexture).m_view.m_levels[1];
      pCStack_b0 = (pTVar2->m_refTexture).m_view.m_levels[2];
      local_a8 = (pTVar2->m_refTexture).m_view.m_levels[3];
      pCStack_a0 = (pTVar2->m_refTexture).m_view.m_levels[4];
      glu::TextureTestUtil::sampleTexture
                (&idealDst,(TextureCubeView *)&score,
                 texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start,&local_160);
      uVar10 = uVar10 + 1;
      lVar11 = lVar11 + 0x10;
    }
    context = this->m_renderCtx;
    tcu::Surface::getAccess((PixelBufferAccess *)&local_160,&renderedFrame);
    glu::readPixels(context,viewport.x,viewport.y,(PixelBufferAccess *)&local_160);
    iVar6 = glu::TextureTestUtil::measureAccuracy
                      (log,&idealFrame,&renderedFrame,(iVar6 / 0x10) * (iVar6 / 0x10),iVar6 * iVar6)
    ;
    score = iVar6;
    this_00 = (this->super_TestCase).super_TestNode.m_testCtx;
    de::toString<int>((string *)&local_160,&score);
    tcu::TestContext::setTestResult
              (this_00,QP_TEST_RESULT_PASS,(char *)local_160.super_RenderParams._0_8_);
    std::__cxx11::string::~string((string *)&local_160);
    std::_Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::~_Vector_base
              (&gridLayout.
                super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>);
    tcu::Surface::~Surface(&idealFrame);
    tcu::Surface::~Surface(&renderedFrame);
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              (&texCoord.super__Vector_base<float,_std::allocator<float>_>);
    return STOP;
  }
  this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_01,"Too small viewport","",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/accuracy/es3aTextureMipmapTests.cpp"
             ,0x21e);
  __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

TextureCubeMipmapCase::IterateResult TextureCubeMipmapCase::iterate (void)
{
	// Constants.
	const deUint32			magFilter			= GL_NEAREST;

	int						texWidth			= m_texture->getRefTexture().getSize();
	int						texHeight			= m_texture->getRefTexture().getSize();

	int						defViewportWidth	= texWidth*2;
	int						defViewportHeight	= texHeight*2;

	const glw::Functions&	gl					= m_renderCtx.getFunctions();
	TestLog&				log					= m_testCtx.getLog();
	RandomViewport			viewport			(m_renderCtx.getRenderTarget(), defViewportWidth, defViewportHeight, deStringHash(getName()));
	tcu::Sampler			sampler				= glu::mapGLSampler(m_wrapS, m_wrapT, m_minFilter, magFilter);
	sampler.seamlessCubeMap = true;

	vector<float>			texCoord;

	bool					isProjected			= m_coordType == COORDTYPE_PROJECTED;
	bool					useLodBias			= m_coordType == COORDTYPE_BASIC_BIAS;

	tcu::Surface			renderedFrame		(viewport.width, viewport.height);

	// Accuracy cases test against ideal lod computation.
	tcu::Surface			idealFrame			(viewport.width, viewport.height);

	// Accuracy measurements are off unless we get the expected viewport size.
	if (viewport.width < defViewportWidth || viewport.height < defViewportHeight)
		throw tcu::NotSupportedError("Too small viewport", "", __FILE__, __LINE__);

	// Upload texture data.
	m_texture->upload();

	// Use unit 0.
	gl.activeTexture(GL_TEXTURE0);

	// Bind gradient texture and setup sampler parameters.
	gl.bindTexture(GL_TEXTURE_CUBE_MAP, m_texture->getGLTexture());
	gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_S,		m_wrapS);
	gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_T,		m_wrapT);
	gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MIN_FILTER,	m_minFilter);
	gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MAG_FILTER,	magFilter);

	GLU_EXPECT_NO_ERROR(gl.getError(), "After texture setup");

	// Compute grid.
	vector<IVec4> gridLayout;
	computeGridLayout(gridLayout, viewport.width, viewport.height);

	// Bias values.
	static const float s_bias[] = { 1.0f, -2.0f, 0.8f, -0.5f, 1.5f, 0.9f, 2.0f, 4.0f };

	// Projection values \note Less agressive than in 2D case due to smaller quads.
	static const Vec4 s_projections[] =
	{
		Vec4(1.2f, 1.0f, 0.7f, 1.0f),
		Vec4(1.3f, 0.8f, 0.6f, 1.1f),
		Vec4(0.8f, 1.0f, 1.2f, 0.8f),
		Vec4(1.2f, 1.0f, 1.3f, 0.9f)
	};

	for (int cellNdx = 0; cellNdx < (int)gridLayout.size(); cellNdx++)
	{
		int				curX		= gridLayout[cellNdx].x();
		int				curY		= gridLayout[cellNdx].y();
		int				curW		= gridLayout[cellNdx].z();
		int				curH		= gridLayout[cellNdx].w();
		tcu::CubeFace	cubeFace	= (tcu::CubeFace)(cellNdx % tcu::CUBEFACE_LAST);
		ReferenceParams	params		(TEXTURETYPE_CUBE);

		params.sampler = sampler;

		DE_ASSERT(m_coordType != COORDTYPE_AFFINE); // Not supported.
		computeQuadTexCoordCube(texCoord, cubeFace);

		if (isProjected)
		{
			params.flags	|= ReferenceParams::PROJECTED;
			params.w		 = s_projections[cellNdx % DE_LENGTH_OF_ARRAY(s_projections)];
		}

		if (useLodBias)
		{
			params.flags	|= ReferenceParams::USE_BIAS;
			params.bias		 = s_bias[cellNdx % DE_LENGTH_OF_ARRAY(s_bias)];
		}

		// Render with GL.
		gl.viewport(viewport.x+curX, viewport.y+curY, curW, curH);
		m_renderer.renderQuad(0, &texCoord[0], params);

		// Render reference(s).
		{
			tcu::SurfaceAccess idealDst(idealFrame, m_renderCtx.getRenderTarget().getPixelFormat(), curX, curY, curW, curH);
			params.lodMode = LODMODE_EXACT;
			sampleTexture(idealDst, m_texture->getRefTexture(), &texCoord[0], params);
		}
	}

	// Read result.
	glu::readPixels(m_renderCtx, viewport.x, viewport.y, renderedFrame.getAccess());

	// Compare and log.
	{
		const int	bestScoreDiff	= (texWidth/16)*(texHeight/16);
		const int	worstScoreDiff	= texWidth*texHeight;

		int score = measureAccuracy(log, idealFrame, renderedFrame, bestScoreDiff, worstScoreDiff);
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, de::toString(score).c_str());
	}

	return STOP;
}